

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QList<Qt::Key> * qvariant_cast<QList<Qt::Key>>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QMetaType QVar4;
  QMetaType *pQVar5;
  void *pvVar6;
  undefined8 *in_RSI;
  Private *in_RDI;
  long in_FS_OFFSET;
  QList<Qt::Key> *t;
  QMetaType targetType;
  QList<Qt::Key> *in_stack_ffffffffffffffa8;
  Private *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QVar4 = QMetaType::fromType<QList<Qt::Key>>();
  QVariant::Private::type(this);
  bVar2 = operator==((QMetaType *)this,(QMetaType *)in_stack_ffffffffffffffa8);
  if (bVar2) {
    if ((in_RSI[3] & 1) == 0) {
      QList<Qt::Key>::QList((QList<Qt::Key> *)this,in_stack_ffffffffffffffa8);
    }
    else {
      iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x5050bb);
      if (iVar3 == 1) {
        QVariant::PrivateShared::data((PrivateShared *)*in_RSI);
        QList<Qt::Key>::QList((QList<Qt::Key> *)this,in_stack_ffffffffffffffa8);
      }
      else {
        QVariant::Private::get<QList<Qt::Key>>((Private *)0x5050e9);
        QList<Qt::Key>::QList((QList<Qt::Key> *)this,in_stack_ffffffffffffffa8);
      }
    }
  }
  else {
    (this->data).shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&this->data + 8) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&this->data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
    memset(this,0,0x18);
    QList<Qt::Key>::QList((QList<Qt::Key> *)0x50513b);
    pQVar5 = (QMetaType *)QVariant::metaType();
    pvVar6 = QVariant::constData((QVariant *)0x505154);
    QMetaType::convert(pQVar5,pvVar6,(QMetaType *)QVar4.d_ptr,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<Qt::Key> *)in_RDI;
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}